

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

jsgf_rule_t * jsgf_optional_new(jsgf_t *jsgf,jsgf_rhs_t *exp)

{
  jsgf_rhs_t *rhs;
  undefined8 *ptr;
  char *pcVar1;
  glist_t pgVar2;
  jsgf_rule_t *pjVar3;
  
  rhs = (jsgf_rhs_t *)
        __ckd_calloc__(1,0x10,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                       ,0xb5);
  ptr = (undefined8 *)
        __ckd_calloc__(1,0x18,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                       ,0x43);
  pcVar1 = __ckd_salloc__("<NULL>",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x44);
  *ptr = pcVar1;
  *(undefined4 *)(ptr + 2) = 0x3f800000;
  rhs->alt = exp;
  pgVar2 = glist_add_ptr((glist_t)0x0,ptr);
  rhs->atoms = pgVar2;
  pjVar3 = jsgf_define_rule(jsgf,(char *)0x0,rhs,0);
  return pjVar3;
}

Assistant:

jsgf_rule_t *
jsgf_optional_new(jsgf_t * jsgf, jsgf_rhs_t * exp)
{
    jsgf_rhs_t *rhs = ckd_calloc(1, sizeof(*rhs));
    jsgf_atom_t *atom = jsgf_atom_new("<NULL>", 1.0);
    rhs->alt = exp;
    rhs->atoms = glist_add_ptr(NULL, atom);
    return jsgf_define_rule(jsgf, NULL, rhs, 0);
}